

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTestLog.cpp
# Opt level: O1

void __thiscall
tcu::TestLog::writeImage
          (TestLog *this,char *name,char *description,ConstPixelBufferAccess *access,
          Vec4 *pixelScale,Vec4 *pixelBias,qpImageCompressionMode compressionMode)

{
  int iVar1;
  IVec3 *pIVar2;
  bool bVar3;
  _func_int **pp_Var4;
  _func_int **pp_Var5;
  int i;
  deUint32 dVar6;
  int iVar7;
  long lVar8;
  size_t sVar9;
  ostream *poVar10;
  ulong uVar11;
  int iVar12;
  int iVar13;
  int y;
  int iVar14;
  int z;
  int iVar15;
  ulong uVar16;
  uint uVar17;
  uint uVar18;
  float fVar19;
  float fVar20;
  undefined1 auStack_368 [8];
  Sampler *local_360;
  ulong local_358;
  float local_34c;
  float local_348;
  float local_344;
  ulong local_340;
  IVec3 scaledSize;
  Vec4 s;
  Vec4 p;
  long local_2c8 [2];
  PixelBufferAccess logImageAccess;
  vector<float,_std::allocator<float>_> blendImage;
  Vec4 b;
  PixelBufferAccess blendImageAccess;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined1 local_210;
  undefined8 local_20c;
  undefined1 uStack_204;
  undefined7 uStack_203;
  undefined1 uStack_1fc;
  undefined8 uStack_1fb;
  undefined4 local_1f0;
  ulong local_1e8;
  TextureLevel logImage;
  Vector<float,_4> res;
  ostringstream longDesc;
  
  pIVar2 = &access->m_size;
  iVar12 = pIVar2->m_data[0];
  uVar18 = (access->m_size).m_data[1];
  pp_Var5 = *(_func_int ***)pIVar2->m_data;
  pp_Var4 = *(_func_int ***)pIVar2->m_data;
  iVar14 = (access->m_size).m_data[2];
  local_360 = (Sampler *)access;
  dVar6 = qpTestLog_getLogFlags(this->m_log);
  if ((dVar6 & 1) == 0) {
    if (iVar14 == 1) {
      if (((((0x1000 < (int)uVar18) || (0x1000 < iVar12)) ||
           ((local_360->wrapT != REPEAT_CL ||
            ((1 < ((TextureFormat *)&local_360->wrapS)->order - RGB ||
             (iVar14 = ((IVec3 *)&local_360->lodThreshold)->m_data[0],
             iVar7 = TextureFormat::getPixelSize((TextureFormat *)local_360), iVar14 != iVar7))))))
          || ((pixelBias->m_data[0] != 0.0 ||
              ((((pixelBias->m_data[1] != 0.0 || (NAN(pixelBias->m_data[1]))) ||
                (pixelBias->m_data[2] != 0.0)) ||
               ((NAN(pixelBias->m_data[2]) || (pixelBias->m_data[3] != 0.0)))))))) ||
         (((((NAN(pixelBias->m_data[3]) ||
             ((pixelScale->m_data[0] != 1.0 || (NAN(pixelScale->m_data[0]))))) ||
            (pixelScale->m_data[1] != 1.0)) ||
           (((NAN(pixelScale->m_data[1]) || (pixelScale->m_data[2] != 1.0)) ||
            (NAN(pixelScale->m_data[2]))))) ||
          ((pixelScale->m_data[3] != 1.0 || (NAN(pixelScale->m_data[3]))))))) {
        local_228 = 0;
        uStack_220 = 0x100000000;
        local_218 = 0;
        local_210 = 1;
        local_1f0 = 0;
        local_20c = 0;
        uStack_204 = 0;
        uStack_203 = 0;
        uStack_1fc = 0;
        uStack_1fb = 0;
        longDesc.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream = pp_Var5;
        bVar3 = true;
        lVar8 = 0;
        do {
          if (bVar3) {
            bVar3 = *(int *)((long)&longDesc.super_basic_ostream<char,_std::char_traits<char>_>.
                                    _vptr_basic_ostream + lVar8 * 4) < 0x1001;
          }
          else {
            bVar3 = false;
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 == 1);
        s.m_data._0_8_ = pp_Var5;
        if (!bVar3) {
          fVar19 = 1.0;
          lVar8 = 0;
          do {
            fVar20 = (float)*(int *)((long)&longDesc.
                                            super_basic_ostream<char,_std::char_traits<char>_>.
                                            _vptr_basic_ostream + lVar8 * 4) * 0.00024414062;
            uVar18 = -(uint)(fVar20 <= fVar19);
            fVar19 = (float)((uint)fVar19 & uVar18 | ~uVar18 & (uint)fVar20);
            lVar8 = lVar8 + 1;
          } while (lVar8 == 1);
          s.m_data[0] = 0.0;
          s.m_data[1] = 0.0;
          lVar8 = 0;
          do {
            fVar20 = (float)*(int *)((long)&longDesc.
                                            super_basic_ostream<char,_std::char_traits<char>_>.
                                            _vptr_basic_ostream + lVar8 * 4) / fVar19;
            fVar20 = (float)(int)(fVar20 + *(float *)(&DAT_01bbbf24 + (ulong)(fVar20 < 0.0) * 4));
            if ((int)fVar20 < 2) {
              fVar20 = 1.4013e-45;
            }
            s.m_data[lVar8] = fVar20;
            lVar8 = lVar8 + 1;
          } while (lVar8 == 1);
        }
        longDesc.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
             (_func_int **)0x300000008;
        TextureLevel::TextureLevel
                  ((TextureLevel *)&blendImageAccess,(TextureFormat *)&longDesc,(int)s.m_data[0],
                   (int)s.m_data[1],1);
        TextureLevel::getAccess((PixelBufferAccess *)&logImage,(TextureLevel *)&blendImageAccess);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&longDesc);
        if (description == (char *)0x0) {
          std::ios::clear((int)auStack_368 +
                          (int)longDesc.super_basic_ostream<char,_std::char_traits<char>_>.
                               _vptr_basic_ostream[-3] + 0x1c0);
        }
        else {
          sVar9 = strlen(description);
          std::__ostream_insert<char,std::char_traits<char>>
                    (&longDesc.super_basic_ostream<char,_std::char_traits<char>_>,description,sVar9)
          ;
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  (&longDesc.super_basic_ostream<char,_std::char_traits<char>_>," (p\' = p * ",0xb);
        poVar10 = tcu::operator<<(&longDesc.super_basic_ostream<char,_std::char_traits<char>_>,
                                  pixelScale);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10," + ",3);
        poVar10 = tcu::operator<<(poVar10,pixelBias);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,")",1);
        if (0 < blendImageAccess.super_ConstPixelBufferAccess.m_size.m_data[1]) {
          iVar12 = 0;
          do {
            if (0 < blendImageAccess.super_ConstPixelBufferAccess.m_size.m_data[0]) {
              local_34c = (float)iVar12 + 0.5;
              iVar14 = 0;
              do {
                ConstPixelBufferAccess::sample2D
                          ((ConstPixelBufferAccess *)&blendImage,local_360,(FilterMode)&local_228,
                           ((float)iVar14 + 0.5) /
                           (float)blendImageAccess.super_ConstPixelBufferAccess.m_size.m_data[0],
                           local_34c /
                           (float)blendImageAccess.super_ConstPixelBufferAccess.m_size.m_data[1],
                           uStack_220._4_4_);
                p.m_data[0] = 0.0;
                p.m_data[1] = 0.0;
                p.m_data[2] = 0.0;
                p.m_data[3] = 0.0;
                lVar8 = 0;
                do {
                  p.m_data[lVar8] = b.m_data[lVar8 + -6] * pixelScale->m_data[lVar8];
                  lVar8 = lVar8 + 1;
                } while (lVar8 != 4);
                logImageAccess.super_ConstPixelBufferAccess.m_format.order = R;
                logImageAccess.super_ConstPixelBufferAccess.m_format.type = SNORM_INT8;
                logImageAccess.super_ConstPixelBufferAccess.m_size.m_data[0] = 0;
                logImageAccess.super_ConstPixelBufferAccess.m_size.m_data[1] = 0;
                lVar8 = 0;
                do {
                  logImageAccess.super_ConstPixelBufferAccess.m_size.m_data[lVar8 + -2] =
                       (int)(p.m_data[lVar8] + pixelBias->m_data[lVar8]);
                  lVar8 = lVar8 + 1;
                } while (lVar8 != 4);
                PixelBufferAccess::setPixel
                          ((PixelBufferAccess *)&logImage,(Vec4 *)&logImageAccess,iVar14,iVar12,0);
                iVar14 = iVar14 + 1;
              } while (iVar14 < blendImageAccess.super_ConstPixelBufferAccess.m_size.m_data[0]);
            }
            iVar12 = iVar12 + 1;
          } while (iVar12 < blendImageAccess.super_ConstPixelBufferAccess.m_size.m_data[1]);
        }
        std::__cxx11::stringbuf::str();
        writeImage(this,name,(char *)logImageAccess.super_ConstPixelBufferAccess.m_format,
                   compressionMode,QP_IMAGE_FORMAT_RGBA8888,logImage.m_size.m_data[0],
                   logImage.m_size.m_data[1],(int)logImage.m_data.m_ptr,
                   (void *)logImage.m_data.m_cap);
        if (logImageAccess.super_ConstPixelBufferAccess.m_format !=
            (TextureFormat)(logImageAccess.super_ConstPixelBufferAccess.m_size.m_data + 2)) {
          operator_delete((void *)logImageAccess.super_ConstPixelBufferAccess.m_format,
                          logImageAccess.super_ConstPixelBufferAccess._16_8_ + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&longDesc);
        std::ios_base::~ios_base
                  ((ios_base *)
                   &longDesc.super_basic_ostream<char,_std::char_traits<char>_>.field_0x70);
        TextureLevel::~TextureLevel((TextureLevel *)&blendImageAccess);
      }
      else {
        writeImage(this,name,description,compressionMode,
                   (uint)(((TextureFormat *)&local_360->wrapS)->order == RGBA),iVar12,uVar18,
                   *(int *)&local_360->normalizedCoords,*(void **)&local_360->compareChannel);
      }
    }
    else {
      longDesc.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream = pp_Var4;
      longDesc.super_basic_ostream<char,_std::char_traits<char>_>._8_4_ = iVar14;
      bVar3 = true;
      lVar8 = 0;
      do {
        if (bVar3) {
          bVar3 = *(int *)((long)&longDesc.super_basic_ostream<char,_std::char_traits<char>_>.
                                  _vptr_basic_ostream + lVar8 * 4) < 0x81;
        }
        else {
          bVar3 = false;
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 != 3);
      scaledSize.m_data._0_8_ = pp_Var4;
      scaledSize.m_data[2] = iVar14;
      if (!bVar3) {
        fVar19 = 1.0;
        lVar8 = 0;
        do {
          fVar20 = (float)*(int *)((long)&longDesc.
                                          super_basic_ostream<char,_std::char_traits<char>_>.
                                          _vptr_basic_ostream + lVar8 * 4) * 0.0078125;
          uVar17 = -(uint)(fVar20 <= fVar19);
          fVar19 = (float)((uint)fVar19 & uVar17 | ~uVar17 & (uint)fVar20);
          lVar8 = lVar8 + 1;
        } while (lVar8 != 3);
        scaledSize.m_data[2] = 0;
        scaledSize.m_data[0] = 0;
        scaledSize.m_data[1] = 0;
        lVar8 = 0;
        do {
          fVar20 = (float)*(int *)((long)&longDesc.
                                          super_basic_ostream<char,_std::char_traits<char>_>.
                                          _vptr_basic_ostream + lVar8 * 4) / fVar19;
          iVar12 = (int)(fVar20 + *(float *)(&DAT_01bbbf24 + (ulong)(fVar20 < 0.0) * 4));
          if (iVar12 < 2) {
            iVar12 = 1;
          }
          scaledSize.m_data[lVar8] = iVar12;
          lVar8 = lVar8 + 1;
        } while (lVar8 != 3);
      }
      iVar14 = scaledSize.m_data[2];
      iVar12 = scaledSize.m_data[0];
      uVar16 = scaledSize.m_data._0_8_ & 0xffffffff;
      local_340 = (ulong)(uint)scaledSize.m_data[1];
      uVar11 = (ulong)(uint)scaledSize.m_data[2];
      iVar7 = scaledSize.m_data[2] + scaledSize.m_data[0] + -1;
      iVar13 = scaledSize.m_data[2] + scaledSize.m_data[0] + scaledSize.m_data[1];
      longDesc.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
           (_func_int **)((ulong)uVar18 << 0x20);
      std::vector<float,_std::allocator<float>_>::vector
                (&blendImage,(long)(iVar13 * iVar7 * 4),(value_type_conflict2 *)&longDesc,
                 (allocator_type *)&local_228);
      longDesc.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
           (_func_int **)0x2300000008;
      PixelBufferAccess::PixelBufferAccess
                (&blendImageAccess,(TextureFormat *)&longDesc,iVar7,iVar13,1,
                 blendImage.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start);
      longDesc.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
           (_func_int **)0x300000008;
      TextureLevel::TextureLevel(&logImage,(TextureFormat *)&longDesc,iVar7,iVar13,1);
      TextureLevel::getAccess(&logImageAccess,&logImage);
      local_228 = 0;
      uStack_220 = 0;
      local_218 = 0;
      local_210 = 1;
      local_1f0 = 0;
      local_20c = 0;
      uStack_204 = 0;
      uStack_203 = 0;
      uStack_1fc = 0;
      uStack_1fb = 0;
      local_34c = (float)iVar13;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&longDesc);
      uVar18 = iVar14 - 1;
      if (-1 < (int)uVar18) {
        fVar19 = (float)(int)(float)local_340;
        local_348 = (float)iVar12;
        local_358 = uVar11;
        do {
          uVar11 = (ulong)uVar18;
          local_1e8 = local_358;
          if (0 < (int)(float)local_340) {
            iVar7 = 0;
            local_358 = (ulong)uVar18;
            do {
              if (0 < iVar12) {
                iVar15 = (int)local_1e8;
                local_344 = ((float)iVar7 + 0.5) / fVar19;
                iVar13 = 0;
                do {
                  iVar1 = iVar13 + 1;
                  y = (iVar12 - iVar1) + (int)local_358;
                  z = (int)local_34c - (iVar15 + iVar7 + iVar13);
                  ConstPixelBufferAccess::getPixel
                            ((ConstPixelBufferAccess *)&p,(int)&blendImageAccess,y,z);
                  ConstPixelBufferAccess::sample3D
                            ((ConstPixelBufferAccess *)&s,local_360,(FilterMode)&local_228,
                             ((float)iVar13 + 0.5) / local_348,local_344,
                             ((float)(int)uVar18 + 0.5) / (float)iVar14);
                  res.m_data[0] = 0.0;
                  res.m_data[1] = 0.0;
                  res.m_data[2] = 0.0;
                  res.m_data[3] = 0.0;
                  lVar8 = 0;
                  do {
                    res.m_data[lVar8] = p.m_data[lVar8] * 0.85;
                    lVar8 = lVar8 + 1;
                  } while (lVar8 != 4);
                  b.m_data[0] = 0.0;
                  b.m_data[1] = 0.0;
                  b.m_data[2] = 0.0;
                  b.m_data[3] = 0.0;
                  lVar8 = 0;
                  do {
                    b.m_data[lVar8] = s.m_data[lVar8] + res.m_data[lVar8];
                    lVar8 = lVar8 + 1;
                  } while (lVar8 != 4);
                  PixelBufferAccess::setPixel(&blendImageAccess,&b,y,z,0);
                  iVar13 = iVar1;
                } while (iVar12 != iVar1);
              }
              iVar7 = iVar7 + 1;
              uVar11 = local_358;
            } while ((float)iVar7 != (float)local_340);
          }
          local_358 = uVar11;
          uVar18 = (int)local_358 - 1;
        } while (0 < (int)local_358);
      }
      if (description == (char *)0x0) {
        std::ios::clear((int)auStack_368 +
                        (int)longDesc.super_basic_ostream<char,_std::char_traits<char>_>.
                             _vptr_basic_ostream[-3] + 0x1c0);
      }
      else {
        sVar9 = strlen(description);
        std::__ostream_insert<char,std::char_traits<char>>
                  (&longDesc.super_basic_ostream<char,_std::char_traits<char>_>,description,sVar9);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                (&longDesc.super_basic_ostream<char,_std::char_traits<char>_>," (p\' = p * ",0xb);
      poVar10 = tcu::operator<<(&longDesc.super_basic_ostream<char,_std::char_traits<char>_>,
                                pixelScale);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10," + ",3);
      poVar10 = tcu::operator<<(poVar10,pixelBias);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,")",1);
      p.m_data[0] = 7.14662e-44;
      p.m_data[1] = 1.42932e-43;
      p.m_data[2] = 2.14399e-43;
      p.m_data[3] = 3.57331e-43;
      local_360 = (Sampler *)uVar16;
      tcu::clear(&logImageAccess,(IVec4 *)&p);
      if (0 < iVar14) {
        iVar12 = (int)local_340;
        local_344 = (float)(iVar12 + -1);
        local_358 = 0;
        do {
          if (0 < (int)(float)local_340) {
            local_348 = (float)((int)local_360 + (int)local_358);
            fVar19 = 0.0;
            do {
              if (0 < (int)(uint)local_360) {
                iVar7 = (int)local_358;
                uVar18 = 0;
                do {
                  if ((((fVar19 == (float)(iVar12 + -2)) || (fVar19 == local_344)) ||
                      ((int)local_358 == 0)) || (uVar18 == 0)) {
                    iVar13 = ~uVar18 + (int)local_348;
                    iVar15 = ~(iVar7 + (int)fVar19 + uVar18) + (int)local_34c;
                    ConstPixelBufferAccess::getPixel
                              ((ConstPixelBufferAccess *)&b,(int)&blendImageAccess,iVar13,iVar15);
                    s.m_data[0] = 0.0;
                    s.m_data[1] = 0.0;
                    s.m_data[2] = 0.0;
                    s.m_data[3] = 0.0;
                    lVar8 = 0;
                    do {
                      s.m_data[lVar8] = b.m_data[lVar8] * pixelScale->m_data[lVar8];
                      lVar8 = lVar8 + 1;
                    } while (lVar8 != 4);
                    p.m_data[0] = 0.0;
                    p.m_data[1] = 0.0;
                    p.m_data[2] = 0.0;
                    p.m_data[3] = 0.0;
                    lVar8 = 0;
                    do {
                      p.m_data[lVar8] = s.m_data[lVar8] + pixelBias->m_data[lVar8];
                      lVar8 = lVar8 + 1;
                    } while (lVar8 != 4);
                    PixelBufferAccess::setPixel(&logImageAccess,&p,iVar13,iVar15,0);
                  }
                  uVar18 = uVar18 + 1;
                } while (uVar18 != (uint)local_360);
              }
              fVar19 = (float)((int)fVar19 + 1);
            } while (fVar19 != (float)local_340);
          }
          uVar18 = (int)local_358 + 1;
          local_358 = (ulong)uVar18;
        } while (uVar18 != iVar14);
      }
      std::__cxx11::stringbuf::str();
      writeImage(this,name,(char *)p.m_data._0_8_,compressionMode,QP_IMAGE_FORMAT_RGBA8888,
                 logImageAccess.super_ConstPixelBufferAccess.m_size.m_data[0],
                 logImageAccess.super_ConstPixelBufferAccess.m_size.m_data[1],
                 logImageAccess.super_ConstPixelBufferAccess.m_pitch.m_data[1],
                 logImageAccess.super_ConstPixelBufferAccess.m_data);
      if ((long *)p.m_data._0_8_ != local_2c8) {
        operator_delete((void *)p.m_data._0_8_,local_2c8[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&longDesc);
      std::ios_base::~ios_base
                ((ios_base *)&longDesc.super_basic_ostream<char,_std::char_traits<char>_>.field_0x70
                );
      TextureLevel::~TextureLevel(&logImage);
      if (blendImage.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(blendImage.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)blendImage.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)blendImage.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
    }
  }
  return;
}

Assistant:

void TestLog::writeImage (const char* name, const char* description, const ConstPixelBufferAccess& access, const Vec4& pixelScale, const Vec4& pixelBias, qpImageCompressionMode compressionMode)
{
	const TextureFormat&	format		= access.getFormat();
	int						width		= access.getWidth();
	int						height		= access.getHeight();
	int						depth		= access.getDepth();

	// Writing a combined image does not make sense
	DE_ASSERT(!tcu::isCombinedDepthStencilType(access.getFormat().type));

	// Do not bother with preprocessing if images are not stored
	if ((qpTestLog_getLogFlags(m_log) & QP_TEST_LOG_EXCLUDE_IMAGES) != 0)
		return;

	if (depth == 1 && format.type == TextureFormat::UNORM_INT8
		&& width <= MAX_IMAGE_SIZE_2D && height <= MAX_IMAGE_SIZE_2D
		&& (format.order == TextureFormat::RGB || format.order == TextureFormat::RGBA)
		&& access.getPixelPitch() == access.getFormat().getPixelSize()
		&& pixelBias[0] == 0.0f && pixelBias[1] == 0.0f && pixelBias[2] == 0.0f && pixelBias[3] == 0.0f
		&& pixelScale[0] == 1.0f && pixelScale[1] == 1.0f && pixelScale[2] == 1.0f && pixelScale[3] == 1.0f)
	{
		// Fast-path.
		bool isRGBA = format.order == TextureFormat::RGBA;

		writeImage(name, description, compressionMode,
				   isRGBA ? QP_IMAGE_FORMAT_RGBA8888 : QP_IMAGE_FORMAT_RGB888,
				   width, height, access.getRowPitch(), access.getDataPtr());
	}
	else if (depth == 1)
	{
		Sampler				sampler			(Sampler::CLAMP_TO_EDGE, Sampler::CLAMP_TO_EDGE, Sampler::CLAMP_TO_EDGE, Sampler::LINEAR, Sampler::NEAREST);
		IVec2				logImageSize	= computeScaledSize(IVec2(width, height), MAX_IMAGE_SIZE_2D);
		tcu::TextureLevel	logImage		(TextureFormat(TextureFormat::RGBA, TextureFormat::UNORM_INT8), logImageSize.x(), logImageSize.y(), 1);
		PixelBufferAccess	logImageAccess	= logImage.getAccess();
		std::ostringstream	longDesc;

		longDesc << description << " (p' = p * " << pixelScale << " + " << pixelBias << ")";

		for (int y = 0; y < logImage.getHeight(); y++)
		{
			for (int x = 0; x < logImage.getWidth(); x++)
			{
				float	yf	= ((float)y + 0.5f) / (float)logImage.getHeight();
				float	xf	= ((float)x + 0.5f) / (float)logImage.getWidth();
				Vec4	s	= access.sample2D(sampler, sampler.minFilter, xf, yf, 0)*pixelScale + pixelBias;

				logImageAccess.setPixel(s, x, y);
			}
		}

		writeImage(name, longDesc.str().c_str(), compressionMode, QP_IMAGE_FORMAT_RGBA8888,
				   logImageAccess.getWidth(), logImageAccess.getHeight(), logImageAccess.getRowPitch(),
				   logImageAccess.getDataPtr());
	}
	else
	{
		// Isometric splat volume rendering.
		const float			blendFactor			= 0.85f;
		IVec3				scaledSize			= computeScaledSize(IVec3(width, height, depth), MAX_IMAGE_SIZE_3D);
		int					w					= scaledSize.x();
		int					h					= scaledSize.y();
		int					d					= scaledSize.z();
		int					logImageW			= w+d - 1;
		int					logImageH			= w+d+h;
		std::vector<float>	blendImage			(logImageW*logImageH*4, 0.0f);
		PixelBufferAccess	blendImageAccess	(TextureFormat(TextureFormat::RGBA, TextureFormat::FLOAT), logImageW, logImageH, 1, &blendImage[0]);
		tcu::TextureLevel	logImage			(TextureFormat(TextureFormat::RGBA, TextureFormat::UNORM_INT8), logImageW, logImageH, 1);
		PixelBufferAccess	logImageAccess		= logImage.getAccess();
		Sampler				sampler				(Sampler::CLAMP_TO_EDGE, Sampler::CLAMP_TO_EDGE, Sampler::CLAMP_TO_EDGE, Sampler::NEAREST, Sampler::NEAREST);
		std::ostringstream	longDesc;

		// \note Back-to-front.
		for (int z = d-1; z >= 0; z--)
		{
			for (int y = 0; y < h; y++)
			{
				for (int x = 0; x < w; x++)
				{
					int		px	= w - (x + 1) + z;
					int		py	= (w + d + h) - (x + y + z + 1);

					float	xf	= ((float)x + 0.5f) / (float)w;
					float	yf	= ((float)y + 0.5f) / (float)h;
					float	zf	= ((float)z + 0.5f) / (float)d;

					Vec4	p	= blendImageAccess.getPixel(px, py);
					Vec4	s	= access.sample3D(sampler, sampler.minFilter, xf, yf, zf);
					Vec4	b	= s + p*blendFactor;

					blendImageAccess.setPixel(b, px, py);
				}
			}
		}

		// Scale blend image nicely.
		longDesc << description << " (p' = p * " << pixelScale << " + " << pixelBias << ")";

		// Write to final image.
		tcu::clear(logImageAccess, tcu::IVec4(0x33, 0x66, 0x99, 0xff));

		for (int z = 0; z < d; z++)
		{
			for (int y = 0; y < h; y++)
			{
				for (int x = 0; x < w; x++)
				{
					if (z != 0 && !(x == 0 || y == h-1 || y == h-2))
						continue;

					int		px	= w - (x + 1) + z;
					int		py	= (w + d + h) - (x + y + z + 1);
					Vec4	s	= blendImageAccess.getPixel(px, py)*pixelScale + pixelBias;

					logImageAccess.setPixel(s, px, py);
				}
			}
		}

		writeImage(name, longDesc.str().c_str(), compressionMode, QP_IMAGE_FORMAT_RGBA8888,
				   logImageAccess.getWidth(), logImageAccess.getHeight(), logImageAccess.getRowPitch(),
				   logImageAccess.getDataPtr());
	}
}